

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_ProcessType(int *Type,int nFanin)

{
  int iVar1;
  int nFanin_local;
  int *Type_local;
  
  if (nFanin == 3) {
    iVar1 = -5;
    if (*Type < 5) {
      iVar1 = 5;
    }
    *Type = iVar1 + *Type;
  }
  else if ((*Type == 0) || (*Type == 5)) {
    *Type = nFanin + *Type;
  }
  else if (*Type == nFanin) {
    *Type = 0;
  }
  else if (*Type + nFanin == 3) {
    *Type = 8;
  }
  else if (*Type == 3) {
    iVar1 = 6;
    if (nFanin == 1) {
      iVar1 = 7;
    }
    *Type = iVar1;
  }
  else if (*Type == 4) {
    *Type = 9;
  }
  else if (*Type == nFanin + 5) {
    *Type = 5;
  }
  else if (*Type + nFanin == 8) {
    *Type = 3;
  }
  else if (*Type == 8) {
    iVar1 = 1;
    if (nFanin == 1) {
      iVar1 = 2;
    }
    *Type = iVar1;
  }
  else {
    if (*Type != 9) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn2.c"
                    ,0x357,"void Dtt_ProcessType(int *, int)");
    }
    *Type = 4;
  }
  return;
}

Assistant:

void Dtt_ProcessType( int* Type, int nFanin )
{
    // 0: 1&2, 1: ~1&2, 2: 1&~2, 3: 1|2 = ~(~1&~2), 4: 1^2
    // 5: ~(1&2), 6: ~(~1&2), 7: ~(1&~2), 8: ~1&~2, 9: ~(1^2)
    if ( nFanin == 3 ) // for output negation
        *Type += (*Type<5)? 5: -5;
    else if ( *Type == 0 || *Type == 5 )
        *Type += nFanin;
    else if ( *Type == nFanin ) // 1,1 ; 2,2
        *Type = 0;
    else if ( *Type + nFanin == 3 ) // 1,2 ; 2,1
        *Type = 8;
    else if ( *Type == 3 )
        *Type = (nFanin==1)? 7: 6;
    else if ( *Type == 4 )
        *Type = 9;
    else if ( *Type == nFanin+5 ) // 6,1 ; 7,2
        *Type = 5;
    else if ( *Type + nFanin == 8 ) // 6,2 ; 7,1
        *Type = 3;
    else if ( *Type == 8 )
        *Type = (nFanin==1)? 2: 1;
    else if ( *Type == 9 )
        *Type = 4;
    else
        assert( 0 );
}